

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneIndex::QGraphicsSceneIndex(QGraphicsSceneIndex *this,QGraphicsScene *scene)

{
  QGraphicsSceneIndexPrivate *this_00;
  QGraphicsSceneIndexPrivate *this_01;
  QObject *in_RSI;
  QObject *in_RDI;
  QGraphicsScene *in_stack_ffffffffffffffd8;
  
  this_00 = (QGraphicsSceneIndexPrivate *)operator_new(0x80);
  QGraphicsSceneIndexPrivate::QGraphicsSceneIndexPrivate(this_00,in_stack_ffffffffffffffd8);
  QObject::QObject(in_RDI,&this_00->super_QObjectPrivate,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d34f08;
  this_01 = d_func((QGraphicsSceneIndex *)0xa268f4);
  QGraphicsSceneIndexPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QGraphicsSceneIndex::QGraphicsSceneIndex(QGraphicsScene *scene)
: QObject(*new QGraphicsSceneIndexPrivate(scene), scene)
{
    d_func()->init();
}